

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Aggregate_State_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Aggregate_State_PDU::Decode
          (Aggregate_State_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 *pKVar1;
  vector<KDIS::DATA_TYPE::SilentAggregateSystem,_std::allocator<KDIS::DATA_TYPE::SilentAggregateSystem>_>
  *this_00;
  vector<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>
  *this_01;
  KUINT16 *pKVar2;
  KUINT16 KVar3;
  ushort uVar4;
  VariableDatum *pVVar5;
  KException *this_02;
  int iVar6;
  undefined7 in_register_00000011;
  KUINT16 p;
  ushort uVar7;
  KUINT32 datumID;
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>>>
  *local_a8;
  KUINT32 *local_a0;
  KUINT8 ui8Padding;
  VariableDatum *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88 [2];
  KUINT16 *local_60;
  vector<KDIS::DATA_TYPE::SilentAggregateSystem,_std::allocator<KDIS::DATA_TYPE::SilentAggregateSystem>_>
  *local_58;
  vector<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>
  *local_50;
  KUINT16 *local_48;
  vector<KDIS::DATA_TYPE::EntityIdentifier,_std::allocator<KDIS::DATA_TYPE::EntityIdentifier>_>
  *local_40;
  vector<KDIS::DATA_TYPE::AggregateIdentifier,_std::allocator<KDIS::DATA_TYPE::AggregateIdentifier>_>
  *local_38;
  
  this->m_bNeedsPadding = false;
  this->m_ui16NumberOfPaddingOctets = 0;
  local_38 = &this->m_vAI;
  std::
  vector<KDIS::DATA_TYPE::AggregateIdentifier,_std::allocator<KDIS::DATA_TYPE::AggregateIdentifier>_>
  ::clear(local_38);
  local_40 = &this->m_vEI;
  std::vector<KDIS::DATA_TYPE::EntityIdentifier,_std::allocator<KDIS::DATA_TYPE::EntityIdentifier>_>
  ::clear(local_40);
  std::
  vector<KDIS::DATA_TYPE::SilentAggregateSystem,_std::allocator<KDIS::DATA_TYPE::SilentAggregateSystem>_>
  ::clear(&this->m_vSASL);
  std::
  vector<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>
  ::clear(&this->m_vSESL);
  local_a8 = (vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>>>
              *)&this->m_vVD;
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
  ::clear((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
           *)local_a8);
  this->m_ui32NumVariableDatum = 0;
  this->m_ui16NumAggregates = 0;
  this->m_ui16NumEntities = 0;
  this->m_ui16NumSilentAggregateTypes = 0;
  this->m_ui16NumSilentEntityTypes = 0;
  KVar3 = KDataStream::GetBufferSize(stream);
  iVar6 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar6 = 0;
  }
  if (0x87 < iVar6 + (uint)KVar3) {
    local_58 = &this->m_vSASL;
    local_50 = &this->m_vSESL;
    Header7::Decode(&this->super_Header,stream,ignoreHeader);
    (*(this->m_AggregateID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_AggregateID,stream);
    KDataStream::Read(stream,&this->m_ui8ForceID);
    KDataStream::Read(stream,&this->m_ui8AggState);
    (*(this->m_AggregateType).super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_AggregateType,stream);
    KDataStream::Read<unsigned_int>(stream,&this->m_ui32Formation);
    (*(this->m_AggregateMarking).super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_AggregateMarking,stream);
    (*(this->m_Dimensions).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_Dimensions,stream);
    (*(this->m_Ori).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_Ori,stream);
    (*(this->m_CtrOfMassLoc).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_CtrOfMassLoc,stream)
    ;
    (*(this->m_Vel).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_Vel,stream);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16NumAggregates);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16NumEntities);
    local_48 = &this->m_ui16NumSilentAggregateTypes;
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16NumSilentAggregateTypes);
    local_60 = &this->m_ui16NumSilentEntityTypes;
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16NumSilentEntityTypes);
    uVar4 = (this->m_ui16NumEntities + this->m_ui16NumAggregates) * 2 & 2;
    this->m_ui16NumberOfPaddingOctets = uVar4;
    if (uVar4 != 0) {
      _ui8Padding = (undefined **)((ulong)_ui8Padding & 0xffffffffffffff00);
      for (uVar7 = 0; uVar7 < uVar4; uVar7 = uVar7 + 1) {
        KDataStream::Read(stream,&ui8Padding);
        uVar4 = this->m_ui16NumberOfPaddingOctets;
      }
    }
    local_a0 = &this->m_ui32NumVariableDatum;
    for (uVar4 = 0; pKVar2 = local_48, uVar4 < this->m_ui16NumAggregates; uVar4 = uVar4 + 1) {
      DATA_TYPE::AggregateIdentifier::AggregateIdentifier((AggregateIdentifier *)&ui8Padding,stream)
      ;
      std::
      vector<KDIS::DATA_TYPE::AggregateIdentifier,_std::allocator<KDIS::DATA_TYPE::AggregateIdentifier>_>
      ::emplace_back<KDIS::DATA_TYPE::AggregateIdentifier>
                (local_38,(AggregateIdentifier *)&ui8Padding);
      DATA_TYPE::AggregateIdentifier::~AggregateIdentifier((AggregateIdentifier *)&ui8Padding);
    }
    for (uVar4 = 0; uVar7 = this->m_ui16NumEntities, uVar4 < uVar7; uVar4 = uVar4 + 1) {
      DATA_TYPE::EntityIdentifier::EntityIdentifier((EntityIdentifier *)&ui8Padding,stream);
      std::
      vector<KDIS::DATA_TYPE::EntityIdentifier,_std::allocator<KDIS::DATA_TYPE::EntityIdentifier>_>
      ::emplace_back<KDIS::DATA_TYPE::EntityIdentifier>(local_40,(EntityIdentifier *)&ui8Padding);
      DATA_TYPE::EntityIdentifier::~EntityIdentifier((EntityIdentifier *)&ui8Padding);
    }
    this->m_ui16NumberOfPaddingOctets = (uVar7 + this->m_ui16NumAggregates) * 2 & 2;
    if (this->m_bNeedsPadding != false) {
      KDataStream::Read<unsigned_short>(stream,&this->m_ui16Padding1);
    }
    this_01 = local_50;
    this_00 = local_58;
    for (uVar4 = 0; pKVar1 = local_60, uVar4 < *pKVar2; uVar4 = uVar4 + 1) {
      DATA_TYPE::SilentAggregateSystem::SilentAggregateSystem
                ((SilentAggregateSystem *)&ui8Padding,stream);
      std::
      vector<KDIS::DATA_TYPE::SilentAggregateSystem,_std::allocator<KDIS::DATA_TYPE::SilentAggregateSystem>_>
      ::emplace_back<KDIS::DATA_TYPE::SilentAggregateSystem>
                (this_00,(SilentAggregateSystem *)&ui8Padding);
      DATA_TYPE::SilentAggregateSystem::~SilentAggregateSystem((SilentAggregateSystem *)&ui8Padding)
      ;
    }
    for (uVar4 = 0; uVar4 < *pKVar1; uVar4 = uVar4 + 1) {
      DATA_TYPE::SilentEntitySystem::SilentEntitySystem((SilentEntitySystem *)&ui8Padding,stream);
      std::
      vector<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>
      ::emplace_back<KDIS::DATA_TYPE::SilentEntitySystem>(this_01,(SilentEntitySystem *)&ui8Padding)
      ;
      DATA_TYPE::SilentEntitySystem::~SilentEntitySystem((SilentEntitySystem *)&ui8Padding);
    }
    KDataStream::Read<unsigned_int>(stream,local_a0);
    for (uVar4 = 0; (uint)uVar4 < *local_a0; uVar4 = uVar4 + 1) {
      KVar3 = KDataStream::GetCurrentWritePosition(stream);
      KDataStream::Read<unsigned_int>(stream,&datumID);
      KDataStream::SetCurrentWritePosition(stream,KVar3);
      pVVar5 = DATA_TYPE::FactoryDecoderUser<KDIS::DATA_TYPE::VariableDatum>::FactoryDecode
                         (datumID,stream);
      if (pVVar5 == (VariableDatum *)0x0) {
        pVVar5 = (VariableDatum *)operator_new(0x28);
        DATA_TYPE::VariableDatum::VariableDatum(pVVar5,stream);
        _ui8Padding = &PTR__KRef_Ptr_002171d8;
        local_90 = pVVar5;
        local_88[0]._0_8_ = operator_new(2);
        *(undefined2 *)local_88[0]._0_8_ = 1;
        std::
        vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>>>
        ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>>
                  (local_a8,(KRef_Ptr<KDIS::DATA_TYPE::VariableDatum> *)&ui8Padding);
      }
      else {
        _ui8Padding = &PTR__KRef_Ptr_002171d8;
        local_90 = pVVar5;
        local_88[0]._0_8_ = operator_new(2);
        *(undefined2 *)local_88[0]._0_8_ = 1;
        std::
        vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>>>
        ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>>
                  (local_a8,(KRef_Ptr<KDIS::DATA_TYPE::VariableDatum> *)&ui8Padding);
      }
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>::~KRef_Ptr
                ((KRef_Ptr<KDIS::DATA_TYPE::VariableDatum> *)&ui8Padding);
    }
    return;
  }
  this_02 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ui8Padding,"Decode",(allocator<char> *)&datumID);
  KException::KException(this_02,(KString *)&ui8Padding,2);
  __cxa_throw(this_02,&KException::typeinfo,KException::~KException);
}

Assistant:

void Aggregate_State_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    m_bNeedsPadding = false;
    m_ui16NumberOfPaddingOctets = 0;
    m_vAI.clear();
    m_vEI.clear();
    m_vSASL.clear();
    m_vSESL.clear();
    m_vVD.clear();
    m_ui16NumAggregates = 0;
    m_ui16NumEntities = 0;
    m_ui16NumSilentAggregateTypes = 0;
    m_ui16NumSilentEntityTypes = 0;
    m_ui32NumVariableDatum = 0;

    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < AGGREGATE_STATE_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    Header::Decode( stream, ignoreHeader );

    stream >> KDIS_STREAM m_AggregateID
           >> m_ui8ForceID
           >> m_ui8AggState
           >> KDIS_STREAM m_AggregateType
           >> m_ui32Formation
           >> KDIS_STREAM m_AggregateMarking
           >> KDIS_STREAM m_Dimensions
           >> KDIS_STREAM m_Ori
           >> KDIS_STREAM m_CtrOfMassLoc
           >> KDIS_STREAM m_Vel
           >> m_ui16NumAggregates
           >> m_ui16NumEntities
           >> m_ui16NumSilentAggregateTypes
           >> m_ui16NumSilentEntityTypes;

    // Does the PDU contain padding?
    calcPadding();

    if( needsPadding() )
    {
        KUINT8 ui8Padding = 0;
        for( KUINT16 p = 0; p < m_ui16NumberOfPaddingOctets; ++p )
        {
            stream >> ui8Padding;
        }
    }

    for( KUINT16 i = 0; i < m_ui16NumAggregates; ++i )
    {
        m_vAI.push_back( AggregateIdentifier( stream ) );
    }

    for( KUINT16 j = 0; j < m_ui16NumEntities; ++j )
    {
        m_vEI.push_back( EntityIdentifier( stream ) );
    }

    // Does the PDU contain padding?
    calcPadding();

    if( m_bNeedsPadding )
    {
        stream >> m_ui16Padding1;
    }

    for( KUINT16 k = 0; k < m_ui16NumSilentAggregateTypes; ++k )
    {
        m_vSASL.push_back( SilentAggregateSystem( stream ) );
    }

    for( KUINT16 l = 0; l < m_ui16NumSilentEntityTypes; ++l )
    {
        m_vSESL.push_back( SilentEntitySystem( stream ) );
    }

    stream >> m_ui32NumVariableDatum;

    // VariableDatum
    for( KUINT16 n = 0; n < m_ui32NumVariableDatum; ++n )
    {
        // Save the current write position so we can peek.
        KUINT16 pos = stream.GetCurrentWritePosition();
        KUINT32 datumID;

        // Extract the datum id then reset the stream.
        stream >> datumID;
        stream.SetCurrentWritePosition( pos );

        // Use the factory decoder.
        VariableDatum * p = VariableDatum::FactoryDecode( datumID, stream );

        // Did we find a custom decoder? if not then use the default.
        if( p )
        {
            m_vVD.push_back( VarDtmPtr( p ) );
        }
        else
        {
            // Default
            m_vVD.push_back( VarDtmPtr( new VariableDatum( stream ) ) );
        }
    }
}